

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_dart.cpp
# Opt level: O3

void __thiscall
flatbuffers::dart::DartGenerator::GenImplementationGetters
          (DartGenerator *this,StructDef *struct_def,
          vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
          *non_deprecated_fields,string *code)

{
  Value *value;
  bool bVar1;
  FieldDef *def;
  Namespace *pNVar2;
  EnumDef *this_00;
  EnumVal *ev;
  string *psVar3;
  DartGenerator *pDVar4;
  long *plVar5;
  undefined8 *puVar6;
  pointer ppVar7;
  size_type *psVar8;
  long *plVar9;
  ulong *puVar10;
  undefined8 uVar11;
  ulong uVar12;
  _Alloc_hider _Var13;
  pointer ppEVar14;
  bool bVar15;
  string enum_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  string *local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  DartGenerator *local_1b8;
  ulong *local_1b0;
  long local_1a8;
  ulong local_1a0;
  long lStack_198;
  StructDef *local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  string field_name;
  long *local_148;
  long local_140;
  long local_138;
  long lStack_130;
  string defaultValue;
  string local_100;
  long *local_e0;
  long local_d8;
  long local_d0;
  long lStack_c8;
  string local_c0;
  string local_a0;
  IdlNamer *local_80;
  pointer local_78;
  string type_name;
  string local_50;
  
  ppVar7 = (non_deprecated_fields->
           super__Vector_base<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_1b8 = this;
  local_190 = struct_def;
  if (ppVar7 != (non_deprecated_fields->
                super__Vector_base<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
                )._M_impl.super__Vector_impl_data._M_finish) {
    local_80 = &this->namer_;
    local_1e0 = code;
    do {
      pDVar4 = local_1b8;
      def = ppVar7->second;
      local_78 = ppVar7;
      (*(local_1b8->namer_).super_Namer._vptr_Namer[0x12])(&field_name,local_80,def);
      value = &def->value;
      getDefaultValue_abi_cxx11_(&defaultValue,pDVar4,value);
      bVar15 = defaultValue._M_string_length == 0;
      bVar1 = local_190->fixed;
      pNVar2 = (local_190->super_Definition).defined_namespace;
      local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"");
      bVar15 = (bool)(bVar15 & (bVar1 ^ 1U));
      GenDartTypeName(&type_name,local_1b8,&value->type,pNVar2,def,bVar15,&local_a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
      }
      GenDocComment(&(def->super_Definition).doc_comment,"  ",local_1e0);
      std::operator+(&local_1d8,"  ",&type_name);
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_1d8);
      local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
      psVar8 = (size_type *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar8) {
        local_200.field_2._M_allocated_capacity = *psVar8;
        local_200.field_2._8_8_ = plVar5[3];
      }
      else {
        local_200.field_2._M_allocated_capacity = *psVar8;
        local_200._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_200._M_string_length = plVar5[1];
      *plVar5 = (long)psVar8;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_200,(ulong)field_name._M_dataplus._M_p);
      enum_name._M_dataplus._M_p = (pointer)&enum_name.field_2;
      psVar8 = (size_type *)(plVar5 + 2);
      if ((size_type *)*plVar5 == psVar8) {
        enum_name.field_2._M_allocated_capacity = *psVar8;
        enum_name.field_2._8_8_ = plVar5[3];
      }
      else {
        enum_name.field_2._M_allocated_capacity = *psVar8;
        enum_name._M_dataplus._M_p = (pointer)*plVar5;
      }
      enum_name._M_string_length = plVar5[1];
      *plVar5 = (long)psVar8;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      std::__cxx11::string::_M_append((char *)local_1e0,(ulong)enum_name._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)enum_name._M_dataplus._M_p != &enum_name.field_2) {
        operator_delete(enum_name._M_dataplus._M_p,enum_name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_200._M_dataplus._M_p != &local_200.field_2) {
        operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
        operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
      }
      if ((value->type).base_type == BASE_TYPE_UNION) {
        std::__cxx11::string::append((char *)local_1e0);
        std::operator+(&local_200,"    switch (",&field_name);
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_200);
        psVar3 = local_1e0;
        enum_name._M_dataplus._M_p = (pointer)&enum_name.field_2;
        psVar8 = (size_type *)(plVar5 + 2);
        if ((size_type *)*plVar5 == psVar8) {
          enum_name.field_2._M_allocated_capacity = *psVar8;
          enum_name.field_2._8_8_ = plVar5[3];
        }
        else {
          enum_name.field_2._M_allocated_capacity = *psVar8;
          enum_name._M_dataplus._M_p = (pointer)*plVar5;
        }
        enum_name._M_string_length = plVar5[1];
        *plVar5 = (long)psVar8;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        std::__cxx11::string::_M_append((char *)local_1e0,(ulong)enum_name._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)enum_name._M_dataplus._M_p != &enum_name.field_2) {
          operator_delete(enum_name._M_dataplus._M_p,enum_name.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_200._M_dataplus._M_p != &local_200.field_2) {
          operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
        }
        this_00 = (def->value).type.enum_def;
        ppEVar14 = (this_00->vals).vec.
                   super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        while (ppEVar14 = ppEVar14 + 1,
              ppEVar14 !=
              (this_00->vals).vec.
              super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>.
              _M_impl.super__Vector_impl_data._M_finish) {
          ev = *ppEVar14;
          NamespaceAliasFromUnionType_abi_cxx11_
                    (&enum_name,local_1b8,(this_00->super_Definition).defined_namespace,
                     &ev->union_type);
          EnumDef::ToString_abi_cxx11_(&local_50,this_00,ev);
          plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x363ace);
          local_148 = &local_138;
          plVar9 = plVar5 + 2;
          if ((long *)*plVar5 == plVar9) {
            local_138 = *plVar9;
            lStack_130 = plVar5[3];
          }
          else {
            local_138 = *plVar9;
            local_148 = (long *)*plVar5;
          }
          local_140 = plVar5[1];
          *plVar5 = (long)plVar9;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          plVar5 = (long *)std::__cxx11::string::append((char *)&local_148);
          local_e0 = &local_d0;
          plVar9 = plVar5 + 2;
          if ((long *)*plVar5 == plVar9) {
            local_d0 = *plVar9;
            lStack_c8 = plVar5[3];
          }
          else {
            local_d0 = *plVar9;
            local_e0 = (long *)*plVar5;
          }
          local_d8 = plVar5[1];
          *plVar5 = (long)plVar9;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          puVar6 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_e0,(ulong)enum_name._M_dataplus._M_p);
          local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
          psVar8 = puVar6 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar6 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar8) {
            local_188.field_2._M_allocated_capacity = *psVar8;
            local_188.field_2._8_8_ = puVar6[3];
          }
          else {
            local_188.field_2._M_allocated_capacity = *psVar8;
            local_188._M_dataplus._M_p = (pointer)*puVar6;
          }
          local_188._M_string_length = puVar6[1];
          *puVar6 = psVar8;
          puVar6[1] = 0;
          *(undefined1 *)(puVar6 + 2) = 0;
          plVar5 = (long *)std::__cxx11::string::append((char *)&local_188);
          local_1b0 = &local_1a0;
          puVar10 = (ulong *)(plVar5 + 2);
          if ((ulong *)*plVar5 == puVar10) {
            local_1a0 = *puVar10;
            lStack_198 = plVar5[3];
          }
          else {
            local_1a0 = *puVar10;
            local_1b0 = (ulong *)*plVar5;
          }
          local_1a8 = plVar5[1];
          *plVar5 = (long)puVar10;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          NumToString<unsigned_short>(&local_100,(def->value).offset);
          uVar12 = 0xf;
          if (local_1b0 != &local_1a0) {
            uVar12 = local_1a0;
          }
          if (uVar12 < local_100._M_string_length + local_1a8) {
            uVar11 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_100._M_dataplus._M_p != &local_100.field_2) {
              uVar11 = local_100.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar11 < local_100._M_string_length + local_1a8) goto LAB_001cc327;
            puVar6 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)&local_100,0,(char *)0x0,(ulong)local_1b0)
            ;
          }
          else {
LAB_001cc327:
            puVar6 = (undefined8 *)
                     std::__cxx11::string::_M_append
                               ((char *)&local_1b0,(ulong)local_100._M_dataplus._M_p);
          }
          local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
          psVar8 = puVar6 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar6 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar8) {
            local_1d8.field_2._M_allocated_capacity = *psVar8;
            local_1d8.field_2._8_8_ = puVar6[3];
          }
          else {
            local_1d8.field_2._M_allocated_capacity = *psVar8;
            local_1d8._M_dataplus._M_p = (pointer)*puVar6;
          }
          local_1d8._M_string_length = puVar6[1];
          *puVar6 = psVar8;
          puVar6[1] = 0;
          *(undefined1 *)psVar8 = 0;
          plVar5 = (long *)std::__cxx11::string::append((char *)&local_1d8);
          local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
          psVar8 = (size_type *)(plVar5 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar5 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar8) {
            local_200.field_2._M_allocated_capacity = *psVar8;
            local_200.field_2._8_8_ = plVar5[3];
          }
          else {
            local_200.field_2._M_allocated_capacity = *psVar8;
            local_200._M_dataplus._M_p = (pointer)*plVar5;
          }
          local_200._M_string_length = plVar5[1];
          *plVar5 = (long)psVar8;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          std::__cxx11::string::_M_append((char *)psVar3,(ulong)local_200._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_200._M_dataplus._M_p != &local_200.field_2) {
            operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
            operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_100._M_dataplus._M_p != &local_100.field_2) {
            operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
          }
          if (local_1b0 != &local_1a0) {
            operator_delete(local_1b0,local_1a0 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_188._M_dataplus._M_p != &local_188.field_2) {
            operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
          }
          if (local_e0 != &local_d0) {
            operator_delete(local_e0,local_d0 + 1);
          }
          if (local_148 != &local_138) {
            operator_delete(local_148,local_138 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)enum_name._M_dataplus._M_p != &enum_name.field_2) {
            operator_delete(enum_name._M_dataplus._M_p,enum_name.field_2._M_allocated_capacity + 1);
          }
        }
        std::__cxx11::string::append((char *)psVar3);
        std::__cxx11::string::append((char *)local_1e0);
        std::__cxx11::string::append((char *)local_1e0);
      }
      else {
        std::__cxx11::string::append((char *)local_1e0);
        if (((def->value).type.enum_def != (EnumDef *)0x0) &&
           ((value->type).base_type != BASE_TYPE_VECTOR)) {
          pNVar2 = (local_190->super_Definition).defined_namespace;
          local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"");
          GenDartTypeName(&local_200,local_1b8,&value->type,pNVar2,def,&local_c0);
          plVar5 = (long *)std::__cxx11::string::append((char *)&local_200);
          enum_name._M_dataplus._M_p = (pointer)&enum_name.field_2;
          psVar8 = (size_type *)(plVar5 + 2);
          if ((size_type *)*plVar5 == psVar8) {
            enum_name.field_2._M_allocated_capacity = *psVar8;
            enum_name.field_2._8_8_ = plVar5[3];
          }
          else {
            enum_name.field_2._M_allocated_capacity = *psVar8;
            enum_name._M_dataplus._M_p = (pointer)*plVar5;
          }
          enum_name._M_string_length = plVar5[1];
          *plVar5 = (long)psVar8;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          std::__cxx11::string::_M_append((char *)local_1e0,(ulong)enum_name._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)enum_name._M_dataplus._M_p != &enum_name.field_2) {
            operator_delete(enum_name._M_dataplus._M_p,enum_name.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_200._M_dataplus._M_p != &local_200.field_2) {
            operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
            operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
          }
        }
        GenReaderTypeName_abi_cxx11_
                  (&enum_name,local_1b8,&value->type,(local_190->super_Definition).defined_namespace
                   ,def,false,true,true);
        psVar3 = local_1e0;
        std::__cxx11::string::_M_append((char *)local_1e0,(ulong)enum_name._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)enum_name._M_dataplus._M_p != &enum_name.field_2) {
          operator_delete(enum_name._M_dataplus._M_p,enum_name.field_2._M_allocated_capacity + 1);
        }
        if (local_190->fixed == true) {
          NumToString<unsigned_short>(&local_1d8,(def->value).offset);
          plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_1d8,0,(char *)0x0,0x366782);
          local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
          psVar8 = (size_type *)(plVar5 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar5 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar8) {
            local_200.field_2._M_allocated_capacity = *psVar8;
            local_200.field_2._8_8_ = plVar5[3];
          }
          else {
            local_200.field_2._M_allocated_capacity = *psVar8;
            local_200._M_dataplus._M_p = (pointer)*plVar5;
          }
          local_200._M_string_length = plVar5[1];
          *plVar5 = (long)psVar8;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          plVar5 = (long *)std::__cxx11::string::append((char *)&local_200);
          enum_name._M_dataplus._M_p = (pointer)&enum_name.field_2;
          psVar8 = (size_type *)(plVar5 + 2);
          if ((size_type *)*plVar5 == psVar8) {
            enum_name.field_2._M_allocated_capacity = *psVar8;
            enum_name.field_2._8_8_ = plVar5[3];
          }
          else {
            enum_name.field_2._M_allocated_capacity = *psVar8;
            enum_name._M_dataplus._M_p = (pointer)*plVar5;
          }
          enum_name._M_string_length = plVar5[1];
          *plVar5 = (long)psVar8;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          std::__cxx11::string::_M_append((char *)psVar3,(ulong)enum_name._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)enum_name._M_dataplus._M_p != &enum_name.field_2) {
            operator_delete(enum_name._M_dataplus._M_p,enum_name.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_200._M_dataplus._M_p != &local_200.field_2) {
            operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
          }
          uVar11 = local_1d8.field_2._M_allocated_capacity;
          _Var13._M_p = local_1d8._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
LAB_001cca67:
            operator_delete(_Var13._M_p,uVar11 + 1);
          }
        }
        else {
          std::__cxx11::string::append((char *)psVar3);
          NumToString<unsigned_short>(&enum_name,(def->value).offset);
          psVar3 = local_1e0;
          if (bVar15 == false) {
            std::operator+(&local_188,"(_bc, _bcOffset, ",&enum_name);
            plVar5 = (long *)std::__cxx11::string::append((char *)&local_188);
            local_1b0 = &local_1a0;
            puVar10 = (ulong *)(plVar5 + 2);
            if ((ulong *)*plVar5 == puVar10) {
              local_1a0 = *puVar10;
              lStack_198 = plVar5[3];
            }
            else {
              local_1a0 = *puVar10;
              local_1b0 = (ulong *)*plVar5;
            }
            local_1a8 = plVar5[1];
            *plVar5 = (long)puVar10;
            plVar5[1] = 0;
            *(undefined1 *)(plVar5 + 2) = 0;
            puVar6 = (undefined8 *)
                     std::__cxx11::string::_M_append
                               ((char *)&local_1b0,(ulong)defaultValue._M_dataplus._M_p);
            local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
            psVar8 = puVar6 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar6 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar8) {
              local_1d8.field_2._M_allocated_capacity = *psVar8;
              local_1d8.field_2._8_8_ = puVar6[3];
            }
            else {
              local_1d8.field_2._M_allocated_capacity = *psVar8;
              local_1d8._M_dataplus._M_p = (pointer)*puVar6;
            }
            local_1d8._M_string_length = puVar6[1];
            *puVar6 = psVar8;
            puVar6[1] = 0;
            *(undefined1 *)(puVar6 + 2) = 0;
            plVar5 = (long *)std::__cxx11::string::append((char *)&local_1d8);
            local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
            psVar8 = (size_type *)(plVar5 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar5 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar8) {
              local_200.field_2._M_allocated_capacity = *psVar8;
              local_200.field_2._8_8_ = plVar5[3];
            }
            else {
              local_200.field_2._M_allocated_capacity = *psVar8;
              local_200._M_dataplus._M_p = (pointer)*plVar5;
            }
            local_200._M_string_length = plVar5[1];
            *plVar5 = (long)psVar8;
            plVar5[1] = 0;
            *(undefined1 *)(plVar5 + 2) = 0;
            std::__cxx11::string::_M_append((char *)psVar3,(ulong)local_200._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_200._M_dataplus._M_p != &local_200.field_2) {
              operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
              operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_1b0 != &local_1a0) {
              operator_delete(local_1b0,local_1a0 + 1);
            }
            uVar11 = local_188.field_2._M_allocated_capacity;
            _Var13._M_p = local_188._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_188._M_dataplus._M_p != &local_188.field_2) goto LAB_001cca4b;
          }
          else {
            std::operator+(&local_1d8,"Nullable(_bc, _bcOffset, ",&enum_name);
            plVar5 = (long *)std::__cxx11::string::append((char *)&local_1d8);
            local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
            psVar8 = (size_type *)(plVar5 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar5 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar8) {
              local_200.field_2._M_allocated_capacity = *psVar8;
              local_200.field_2._8_8_ = plVar5[3];
            }
            else {
              local_200.field_2._M_allocated_capacity = *psVar8;
              local_200._M_dataplus._M_p = (pointer)*plVar5;
            }
            local_200._M_string_length = plVar5[1];
            *plVar5 = (long)psVar8;
            plVar5[1] = 0;
            *(undefined1 *)(plVar5 + 2) = 0;
            std::__cxx11::string::_M_append((char *)psVar3,(ulong)local_200._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_200._M_dataplus._M_p != &local_200.field_2) {
              operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1
                             );
            }
            uVar11 = local_1d8.field_2._M_allocated_capacity;
            _Var13._M_p = local_1d8._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
LAB_001cca4b:
              operator_delete(_Var13._M_p,uVar11 + 1);
            }
          }
          uVar11 = enum_name.field_2._M_allocated_capacity;
          _Var13._M_p = enum_name._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)enum_name._M_dataplus._M_p != &enum_name.field_2) goto LAB_001cca67;
        }
        if (((def->value).type.enum_def != (EnumDef *)0x0) &&
           ((value->type).base_type != BASE_TYPE_VECTOR)) {
          std::__cxx11::string::append((char *)local_1e0);
        }
        std::__cxx11::string::append((char *)local_1e0);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)type_name._M_dataplus._M_p != &type_name.field_2) {
        operator_delete(type_name._M_dataplus._M_p,type_name.field_2._M_allocated_capacity + 1);
      }
      code = local_1e0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)defaultValue._M_dataplus._M_p != &defaultValue.field_2) {
        operator_delete(defaultValue._M_dataplus._M_p,defaultValue.field_2._M_allocated_capacity + 1
                       );
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)field_name._M_dataplus._M_p != &field_name.field_2) {
        operator_delete(field_name._M_dataplus._M_p,field_name.field_2._M_allocated_capacity + 1);
      }
      ppVar7 = local_78 + 1;
    } while (ppVar7 != (non_deprecated_fields->
                       super__Vector_base<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish);
  }
  std::__cxx11::string::append((char *)code);
  pDVar4 = local_1b8;
  (*(local_1b8->namer_).super_Namer._vptr_Namer[0xf])(&defaultValue,&local_1b8->namer_,local_190);
  GenToString(&field_name,pDVar4,&defaultValue,non_deprecated_fields);
  std::__cxx11::string::_M_append((char *)code,(ulong)field_name._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)field_name._M_dataplus._M_p != &field_name.field_2) {
    operator_delete(field_name._M_dataplus._M_p,field_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)defaultValue._M_dataplus._M_p != &defaultValue.field_2) {
    operator_delete(defaultValue._M_dataplus._M_p,defaultValue.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void GenImplementationGetters(
      const StructDef &struct_def,
      const std::vector<std::pair<int, FieldDef *>> &non_deprecated_fields,
      std::string &code) {
    for (auto it = non_deprecated_fields.begin();
         it != non_deprecated_fields.end(); ++it) {
      const FieldDef &field = *it->second;

      const std::string field_name = namer_.Field(field);
      const std::string defaultValue = getDefaultValue(field.value);
      const bool isNullable = defaultValue.empty() && !struct_def.fixed;
      const std::string type_name =
          GenDartTypeName(field.value.type, struct_def.defined_namespace, field,
                          isNullable, "");

      GenDocComment(field.doc_comment, "  ", code);

      code += "  " + type_name + " get " + field_name;
      if (field.value.type.base_type == BASE_TYPE_UNION) {
        code += " {\n";
        code += "    switch (" + field_name + "Type?.value) {\n";
        const auto &enum_def = *field.value.type.enum_def;
        for (auto en_it = enum_def.Vals().begin() + 1;
             en_it != enum_def.Vals().end(); ++en_it) {
          const auto &ev = **en_it;
          const auto enum_name = NamespaceAliasFromUnionType(
              enum_def.defined_namespace, ev.union_type);
          code += "      case " + enum_def.ToString(ev) + ": return " +
                  enum_name + ".reader.vTableGetNullable(_bc, _bcOffset, " +
                  NumToString(field.value.offset) + ");\n";
        }
        code += "      default: return null;\n";
        code += "    }\n";
        code += "  }\n";
      } else {
        code += " => ";
        if (field.value.type.enum_def &&
            field.value.type.base_type != BASE_TYPE_VECTOR) {
          code += GenDartTypeName(field.value.type,
                                  struct_def.defined_namespace, field) +
                  (isNullable ? "._createOrNull(" : ".fromValue(");
        }

        code += GenReaderTypeName(field.value.type,
                                  struct_def.defined_namespace, field);
        if (struct_def.fixed) {
          code +=
              ".read(_bc, _bcOffset + " + NumToString(field.value.offset) + ")";
        } else {
          code += ".vTableGet";
          std::string offset = NumToString(field.value.offset);
          if (isNullable) {
            code += "Nullable(_bc, _bcOffset, " + offset + ")";
          } else {
            code += "(_bc, _bcOffset, " + offset + ", " + defaultValue + ")";
          }
        }
        if (field.value.type.enum_def &&
            field.value.type.base_type != BASE_TYPE_VECTOR) {
          code += ")";
        }
        code += ";\n";
      }
    }

    code += "\n";
    code += GenToString(namer_.Type(struct_def), non_deprecated_fields);
  }